

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void draw_map(wchar_t cx,wchar_t cy)

{
  nh_dbuf_entry *pnVar1;
  nh_dbuf_entry (*panVar2) [80];
  wchar_t bg_color_00;
  attr_t extra_attrs;
  long lVar3;
  ulong uVar4;
  wchar_t bg_color;
  curses_symdef syms [4];
  wchar_t local_f4;
  long local_f0;
  int local_e8;
  int local_e4;
  long local_e0;
  curses_symdef_conflict local_d8 [4];
  
  if (mapwin != (WINDOW *)0x0 && display_buffer != (nh_dbuf_entry (*) [80])0x0) {
    local_e4 = (int)mapwin->_cury;
    local_e8 = (int)mapwin->_curx;
    lVar3 = 0x18;
    local_f0 = 0;
    do {
      uVar4 = 0;
      local_e0 = lVar3;
      do {
        panVar2 = display_buffer;
        local_f4 = L'\0';
        pnVar1 = *display_buffer;
        wmove(mapwin,local_f0,uVar4 & 0xffffffff);
        mapglyph((nh_dbuf_entry_conflict *)((long)&pnVar1->effect + lVar3),local_d8,&local_f4);
        if (((settings.hilite_pet == '\0') ||
            ((*(byte *)((long)&(*panVar2)[0].monflags + lVar3) & 1) == 0)) &&
           ((settings.hilite_peaceful == '\0' ||
            ((*(byte *)((long)&(*panVar2)[0].monflags + lVar3) & 0x10) == 0)))) {
          extra_attrs = 0;
          bg_color_00 = local_f4;
          if (local_f4 == L'\0') {
            bg_color_00 = L'\0';
            if (((*(short *)((long)&(*panVar2)[0].mon + lVar3) == 0) &&
                ((&(*panVar2)[0].invis)[lVar3] == '\0')) &&
               (*(short *)((long)&(*panVar2)[0].obj + lVar3) != 0)) {
              extra_attrs = 0;
              if ((*(byte *)((long)&(*panVar2)[0].objflags + lVar3) & 1) != 0) goto LAB_0010bdda;
            }
            else {
              extra_attrs = 0;
            }
          }
        }
        else {
LAB_0010bdda:
          local_f4 = L'\0';
          extra_attrs = 0x40000;
          bg_color_00 = L'\0';
        }
        print_sym((WINDOW_conflict *)mapwin,local_d8,extra_attrs,bg_color_00);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 != 0x4f);
      local_f0 = local_f0 + 1;
      lVar3 = local_e0 + 0x780;
    } while (local_f0 != 0x15);
    wmove(mapwin,local_e4,local_e8);
    wnoutrefresh(mapwin);
  }
  return;
}

Assistant:

void draw_map(int cx, int cy)
{
    int x, y, symcount, cursx, cursy;
    attr_t attr;
    unsigned int frame;
    struct curses_symdef syms[4];

    if (!display_buffer || !mapwin)
	return;

    getyx(mapwin, cursy, cursx);

    frame = 0;

    for (y = 0; y < ROWNO; y++) {
	for (x = 1; x < COLNO; x++) {
	    int bg_color = 0;
	    struct nh_dbuf_entry *dbe = &display_buffer[y][x];

	    /* set the position for each character to prevent incorrect
	     * positioning due to charset issues (IBM chars on a unicode term
	     * or vice versa) */
	    wmove(mapwin, y, x-1);

	    symcount = mapglyph(dbe, syms, &bg_color);
	    attr = A_NORMAL;
	    if ((settings.hilite_pet && (dbe->monflags & MON_TAME)) ||
		(settings.hilite_peaceful && (dbe->monflags & MON_PEACEFUL)) ||
		/* reverse object piles, but don't override stair background
		 * or monsters on top */
		(bg_color == 0 && !dbe->mon && !dbe->invis &&
		 dbe->obj && (dbe->objflags & DOBJ_STACKS))) {
		attr |= A_REVERSE;
		bg_color = 0;
	    }

	    print_sym(mapwin, &syms[frame % symcount], attr, bg_color);
	}
    }

    wmove(mapwin, cursy, cursx);
    wnoutrefresh(mapwin);
}